

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

void __thiscall
FStringTable::LoadLanguage(FStringTable *this,int lumpnum,DWORD code,bool exactMatch,int passnum)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  size_t len;
  StringEntry *pSVar10;
  undefined7 in_register_00000009;
  StringEntry *pSVar11;
  uint uVar12;
  long lVar13;
  FString FVar14;
  FString strName;
  FString strText;
  FScanner sc;
  FString local_158;
  FString local_150;
  int local_144;
  uint local_140;
  uint local_13c;
  FStringTable *local_138;
  FScanner local_130;
  
  uVar8 = 0xff0000;
  if ((int)CONCAT71(in_register_00000009,exactMatch) != 0) {
    uVar8 = 0;
  }
  local_144 = passnum;
  local_138 = this;
  FScanner::FScanner(&local_130,lumpnum);
  FScanner::SetCMode(&local_130,true);
  local_13c = code | uVar8;
  bVar6 = true;
  uVar12 = 0;
  local_140 = uVar8;
LAB_00488ce0:
  do {
    bVar4 = FScanner::GetString(&local_130);
    if (!bVar4) {
LAB_004890a9:
      FScanner::~FScanner(&local_130);
      return;
    }
    bVar4 = FScanner::Compare(&local_130,"[");
    if (!bVar4) {
      if (uVar12 == 0) {
        bVar4 = FScanner::isText(&local_130);
        if (!bVar4) {
          if (LoadLanguage(int,unsigned_int,bool,int)::errordone == '\0') {
            Printf("Skipping binary \'LANGUAGE\' lump.\n");
          }
          LoadLanguage(int,unsigned_int,bool,int)::errordone = '\x01';
          goto LAB_004890a9;
        }
        FScanner::ScriptError(&local_130,"Found a string without a language specified.");
      }
      bVar5 = FScanner::Compare(&local_130,"$");
      bVar4 = bVar6;
      if (bVar5) {
        FScanner::MustGetStringName(&local_130,"ifgame");
        FScanner::MustGetStringName(&local_130,"(");
        FScanner::MustGetString(&local_130);
        bVar4 = FScanner::Compare(&local_130,GameNames[gameinfo.gametype]);
        FScanner::MustGetStringName(&local_130,")");
        FScanner::MustGetString(&local_130);
        bVar4 = (bool)(!bVar4 | bVar6);
      }
      if (bVar4) {
        FScanner::MustGetStringName(&local_130,"=");
        FScanner::MustGetString(&local_130);
        do {
          FScanner::MustGetString(&local_130);
          bVar4 = FScanner::Compare(&local_130,";");
        } while (!bVar4);
      }
      else {
        FString::FString(&local_158,local_130.String);
        FScanner::MustGetStringName(&local_130,"=");
        FScanner::MustGetString(&local_130);
        pcVar3 = local_130.String;
        len = ProcessEscapes(local_130.String);
        FString::FString(&local_150,pcVar3,len);
        FScanner::MustGetString(&local_130);
        while (bVar6 = FScanner::Compare(&local_130,";"), !bVar6) {
          ProcessEscapes(local_130.String);
          FString::operator+=(&local_150,local_130.String);
          FScanner::MustGetString(&local_130);
        }
        uVar8 = MakeKey(local_158.Chars);
        FVar14.Chars = local_158.Chars;
        pSVar10 = (StringEntry *)(local_138->Buckets + (uVar8 & 0x7f));
        do {
          pSVar11 = pSVar10;
          pSVar10 = pSVar11->Next;
          if (pSVar10 == (StringEntry *)0x0) goto LAB_00488ff7;
          iVar9 = strcasecmp(pSVar10->Name,FVar14.Chars);
        } while (iVar9 < 0);
        if (iVar9 == 0) {
          if (local_144 <= (int)(uint)pSVar10->PassNum) {
            pSVar11->Next = pSVar10->Next;
            M_Free(pSVar10);
            FVar14.Chars = local_158.Chars;
            goto LAB_00488ff7;
          }
        }
        else {
LAB_00488ff7:
          pSVar10 = (StringEntry *)
                    M_Malloc_Dbg((ulong)*(uint *)(local_150.Chars + -0xc) +
                                 (ulong)*(uint *)(FVar14.Chars + -0xc) + 0x1a,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/stringtable.cpp"
                                 ,0x11e);
          FVar14.Chars = local_150.Chars;
          pSVar10->Next = pSVar11->Next;
          pSVar11->Next = pSVar10;
          strcpy(&pSVar10->field_0x11,local_150.Chars);
          uVar8 = *(uint *)(FVar14.Chars + -0xc);
          pSVar10->Name = &pSVar10->field_0x12 + uVar8;
          strcpy(&pSVar10->field_0x12 + uVar8,local_158.Chars);
          pSVar10->PassNum = (BYTE)local_144;
        }
        FString::~FString(&local_150);
        FString::~FString(&local_158);
        bVar6 = false;
      }
      goto LAB_00488ce0;
    }
    FScanner::MustGetString(&local_130);
    bVar2 = 1;
    bVar6 = false;
    bVar1 = 0;
    do {
      pcVar3 = local_130.String;
      lVar13 = (long)local_130.StringLen;
      if (local_130.StringLen - 4U < 0xfffffffe) {
        if (local_130.StringLen == 7) {
          iVar9 = strcasecmp(local_130.String,"default");
          if (iVar9 != 0) goto LAB_00488e7b;
          uVar12 = 0x2a2a;
          goto LAB_00488e92;
        }
        if (local_130.StringLen != 1) {
LAB_00488e7b:
          FScanner::ScriptError
                    (&local_130,
                     "The language code must be 2 or 3 characters long.\n\'%s\' is %lu characters long."
                     ,pcVar3,lVar13);
          goto LAB_00488e92;
        }
        if (*local_130.String == '*') {
          uVar12 = 0x2a;
          goto LAB_00488e92;
        }
        if (*local_130.String != '~') goto LAB_00488e7b;
        FScanner::MustGetString(&local_130);
        bVar6 = true;
      }
      else {
        uVar8 = tolower((int)*local_130.String);
        iVar9 = tolower((int)pcVar3[1]);
        iVar7 = tolower((int)pcVar3[2]);
        uVar12 = iVar7 << 0x10 | iVar9 << 8 | uVar8;
LAB_00488e92:
        bVar4 = (uVar12 | local_140) == local_13c;
        if (bVar4) {
          bVar2 = bVar6 & bVar2;
        }
        bVar4 = (bool)(bVar4 & bVar6);
        bVar5 = false;
        if (!bVar4) {
          bVar5 = bVar6;
        }
        FScanner::MustGetString(&local_130);
        bVar1 = bVar1 | bVar4;
        bVar6 = bVar5;
      }
      bVar4 = FScanner::Compare(&local_130,"]");
    } while (!bVar4);
    if (bVar6) {
      FScanner::ScriptError(&local_130,"You must specify a language after ~");
    }
    bVar6 = (bool)(bVar2 | bVar1);
  } while( true );
}

Assistant:

void FStringTable::LoadLanguage (int lumpnum, DWORD code, bool exactMatch, int passnum)
{
	static bool errordone = false;
	const DWORD orMask = exactMatch ? 0 : MAKE_ID(0,0,0xff,0);
	DWORD inCode = 0;
	StringEntry *entry, **pentry;
	DWORD bucket;
	int cmpval;
	bool skip = true;

	code |= orMask;

	FScanner sc(lumpnum);
	sc.SetCMode (true);
	while (sc.GetString ())
	{
		if (sc.Compare ("["))
		{ // Process language identifiers
			bool donot = false;
			bool forceskip = false;
			skip = true;
			sc.MustGetString ();
			do
			{
				size_t len = sc.StringLen;
				if (len != 2 && len != 3)
				{
					if (len == 1 && sc.String[0] == '~')
					{
						donot = true;
						sc.MustGetString ();
						continue;
					}
					if (len == 1 && sc.String[0] == '*')
					{
						inCode = MAKE_ID('*',0,0,0);
					}
					else if (len == 7 && stricmp (sc.String, "default") == 0)
					{
						inCode = MAKE_ID('*','*',0,0);
					}
					else
					{
						sc.ScriptError ("The language code must be 2 or 3 characters long.\n'%s' is %lu characters long.",
							sc.String, len);
					}
				}
				else
				{
					inCode = MAKE_ID(tolower(sc.String[0]), tolower(sc.String[1]), tolower(sc.String[2]), 0);
				}
				if ((inCode | orMask) == code)
				{
					if (donot)
					{
						forceskip = true;
						donot = false;
					}
					else
					{
						skip = false;
					}
				}
				sc.MustGetString ();
			} while (!sc.Compare ("]"));
			if (donot)
			{
				sc.ScriptError ("You must specify a language after ~");
			}
			skip |= forceskip;
		}
		else
		{ // Process string definitions.
			if (inCode == 0)
			{
				// LANGUAGE lump is bad. We need to check if this is an old binary
				// lump and if so just skip it to allow old WADs to run which contain
				// such a lump.
				if (!sc.isText())
				{
					if (!errordone) Printf("Skipping binary 'LANGUAGE' lump.\n"); 
					errordone = true;
					return;
				}
				sc.ScriptError ("Found a string without a language specified.");
			}

			bool savedskip = skip;
			if (sc.Compare("$"))
			{
				sc.MustGetStringName("ifgame");
				sc.MustGetStringName("(");
				sc.MustGetString();
				skip |= !sc.Compare(GameTypeName());
				sc.MustGetStringName(")");
				sc.MustGetString();

			}

			if (skip)
			{ // We're not interested in this language, so skip the string.
				sc.MustGetStringName ("=");
				sc.MustGetString ();
				do
				{
					sc.MustGetString ();
				} 
				while (!sc.Compare (";"));
				skip = savedskip;
				continue;
			}

			FString strName (sc.String);
			sc.MustGetStringName ("=");
			sc.MustGetString ();
			FString strText (sc.String, ProcessEscapes (sc.String));
			sc.MustGetString ();
			while (!sc.Compare (";"))
			{
				ProcessEscapes (sc.String);
				strText += sc.String;
				sc.MustGetString ();
			}

			// Does this string exist? If so, should we overwrite it?
			bucket = MakeKey (strName.GetChars()) & (HASH_SIZE-1);
			pentry = &Buckets[bucket];
			entry = *pentry;
			cmpval = 1;
			while (entry != NULL)
			{
				cmpval = stricmp (entry->Name, strName.GetChars());
				if (cmpval >= 0)
					break;
				pentry = &entry->Next;
				entry = *pentry;
			}
			if (cmpval == 0 && entry->PassNum >= passnum)
			{
				*pentry = entry->Next;
				M_Free (entry);
				entry = NULL;
			}
			if (entry == NULL || cmpval > 0)
			{
				entry = (StringEntry *)M_Malloc (sizeof(*entry) + strText.Len() + strName.Len() + 2);
				entry->Next = *pentry;
				*pentry = entry;
				strcpy (entry->String, strText.GetChars());
				strcpy (entry->Name = entry->String + strText.Len() + 1, strName.GetChars());
				entry->PassNum = passnum;
			}
		}
	}
}